

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_pathmatch.c
# Opt level: O0

wchar_t pm_w(wchar_t *p,wchar_t *s,wchar_t flags)

{
  wchar_t *pwVar1;
  wchar_t wVar2;
  wchar_t *pwVar3;
  bool bVar4;
  wchar_t *local_30;
  wchar_t *end;
  wchar_t *pwStack_20;
  wchar_t flags_local;
  wchar_t *s_local;
  wchar_t *p_local;
  
  pwStack_20 = s;
  if ((*s == L'.') && (s[1] == L'/')) {
    pwStack_20 = pm_slashskip_w(s + 1);
  }
  s_local = p;
  if ((*p == L'.') && (p[1] == L'/')) {
    s_local = pm_slashskip_w(p + 1);
  }
  do {
    wVar2 = *s_local;
    if (wVar2 == L'\0') {
      if (*pwStack_20 == L'/') {
        if ((flags & 2U) != 0) {
          return L'\x01';
        }
        pwStack_20 = pm_slashskip_w(pwStack_20);
      }
      return (uint)(*pwStack_20 == L'\0');
    }
    if (wVar2 == L'$') {
      if ((s_local[1] == L'\0') && ((flags & 2U) != 0)) {
        pwVar3 = pm_slashskip_w(pwStack_20);
        return (uint)(*pwVar3 == L'\0');
      }
LAB_00163940:
      if (*s_local != *pwStack_20) {
        return L'\0';
      }
    }
    else {
      if (wVar2 == L'*') {
        for (; *s_local == L'*'; s_local = s_local + 1) {
        }
        if (*s_local == L'\0') {
          p_local._4_4_ = L'\x01';
        }
        else {
          for (; *pwStack_20 != L'\0'; pwStack_20 = pwStack_20 + 1) {
            wVar2 = __archive_pathmatch_w(s_local,pwStack_20,flags);
            if (wVar2 != L'\0') {
              return L'\x01';
            }
          }
          p_local._4_4_ = L'\0';
        }
        return p_local._4_4_;
      }
      if (wVar2 == L'/') {
        if ((*pwStack_20 != L'/') && (*pwStack_20 != L'\0')) {
          return L'\0';
        }
        pwVar3 = pm_slashskip_w(s_local);
        pwStack_20 = pm_slashskip_w(pwStack_20);
        if ((*pwVar3 == L'\0') && ((flags & 2U) != 0)) {
          return L'\x01';
        }
        s_local = pwVar3 + -1;
        pwStack_20 = pwStack_20 + -1;
      }
      else if (wVar2 == L'?') {
        if (*pwStack_20 == L'\0') {
          return L'\0';
        }
      }
      else {
        pwVar3 = s_local;
        if (wVar2 == L'[') {
          while( true ) {
            pwVar1 = pwVar3;
            local_30 = pwVar1 + 1;
            bVar4 = false;
            if (*local_30 != L'\0') {
              bVar4 = *local_30 != L']';
            }
            if (!bVar4) break;
            pwVar3 = local_30;
            if ((*local_30 == L'\\') && (pwVar3 = local_30, pwVar1[2] != L'\0')) {
              pwVar3 = pwVar1 + 2;
            }
          }
          if (*local_30 == L']') {
            wVar2 = pm_list_w(s_local + 1,local_30,*pwStack_20,flags);
            if (wVar2 == L'\0') {
              return L'\0';
            }
            s_local = local_30;
          }
          else if (*s_local != *pwStack_20) {
            return L'\0';
          }
        }
        else {
          if (wVar2 != L'\\') goto LAB_00163940;
          if (s_local[1] == L'\0') {
            if (*pwStack_20 != L'\\') {
              return L'\0';
            }
          }
          else {
            s_local = s_local + 1;
            if (*s_local != *pwStack_20) {
              return L'\0';
            }
          }
        }
      }
    }
    s_local = s_local + 1;
    pwStack_20 = pwStack_20 + 1;
  } while( true );
}

Assistant:

static int
pm_w(const wchar_t *p, const wchar_t *s, int flags)
{
	const wchar_t *end;

	/*
	 * Ignore leading './', './/', '././', etc.
	 */
	if (s[0] == L'.' && s[1] == L'/')
		s = pm_slashskip_w(s + 1);
	if (p[0] == L'.' && p[1] == L'/')
		p = pm_slashskip_w(p + 1);

	for (;;) {
		switch (*p) {
		case L'\0':
			if (s[0] == L'/') {
				if (flags & PATHMATCH_NO_ANCHOR_END)
					return (1);
				/* "dir" == "dir/" == "dir/." */
				s = pm_slashskip_w(s);
			}
			return (*s == L'\0');
		case L'?':
			/* ? always succeeds, unless we hit end of 's' */
			if (*s == L'\0')
				return (0);
			break;
		case L'*':
			/* "*" == "**" == "***" ... */
			while (*p == L'*')
				++p;
			/* Trailing '*' always succeeds. */
			if (*p == L'\0')
				return (1);
			while (*s) {
				if (archive_pathmatch_w(p, s, flags))
					return (1);
				++s;
			}
			return (0);
		case L'[':
			/*
			 * Find the end of the [...] character class,
			 * ignoring \] that might occur within the class.
			 */
			end = p + 1;
			while (*end != L'\0' && *end != L']') {
				if (*end == L'\\' && end[1] != L'\0')
					++end;
				++end;
			}
			if (*end == L']') {
				/* We found [...], try to match it. */
				if (!pm_list_w(p + 1, end, *s, flags))
					return (0);
				p = end; /* Jump to trailing ']' char. */
				break;
			} else
				/* No final ']', so just match '['. */
				if (*p != *s)
					return (0);
			break;
		case L'\\':
			/* Trailing '\\' matches itself. */
			if (p[1] == L'\0') {
				if (*s != L'\\')
					return (0);
			} else {
				++p;
				if (*p != *s)
					return (0);
			}
			break;
		case L'/':
			if (*s != L'/' && *s != L'\0')
				return (0);
			/* Note: pattern "/\./" won't match "/";
			 * pm_slashskip() correctly stops at backslash. */
			p = pm_slashskip_w(p);
			s = pm_slashskip_w(s);
			if (*p == L'\0' && (flags & PATHMATCH_NO_ANCHOR_END))
				return (1);
			--p; /* Counteract the increment below. */
			--s;
			break;
		case L'$':
			/* '$' is special only at end of pattern and only
			 * if PATHMATCH_NO_ANCHOR_END is specified. */
			if (p[1] == L'\0' && (flags & PATHMATCH_NO_ANCHOR_END)){
				/* "dir" == "dir/" == "dir/." */
				return (*pm_slashskip_w(s) == L'\0');
			}
			/* Otherwise, '$' is not special. */
			/* FALL THROUGH */
		default:
			if (*p != *s)
				return (0);
			break;
		}
		++p;
		++s;
	}
}